

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>
::multiply_target_and_add_to
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>
           *this,Index sourceColumnIndex,Field_element *coefficient,Index targetColumnIndex)

{
  key_type kVar1;
  undefined4 uVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  __hashtable *__h;
  ID_index pivot;
  Index local_4c;
  key_type local_48;
  key_type local_44;
  anon_class_32_4_5df6e713 local_40;
  
  local_40.col = (Column *)CONCAT44(local_40.col._4_4_,targetColumnIndex);
  local_4c = sourceColumnIndex;
  iVar3 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->matrix_)._M_h,(key_type *)&local_40);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    local_40.col = (Column *)
                   ((long)iVar3.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>_>,_false>
                          ._M_cur + 0x10);
    local_40.sourceColumnIndex = &local_4c;
    kVar1 = *(key_type *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>_>,_false>
                    ._M_cur + 0x24);
    local_48 = kVar1;
    local_40.coefficient = coefficient;
    local_40.this = this;
    multiply_target_and_add_to::anon_class_32_4_5df6e713::operator()(&local_40);
    if (kVar1 == *(key_type *)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>_>,_false>
                         ._M_cur + 0x24)) {
      return;
    }
    iVar4 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->pivotToColumnIndex_)._M_h,&local_48);
    if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
        != (__node_type *)0x0) {
      local_44 = *(key_type *)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_true,_false,_true>_>_>_>,_false>
                         ._M_cur + 0x24);
      iVar5 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->pivotToColumnIndex_)._M_h,&local_44);
      if (iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          != (__node_type *)0x0) {
        uVar2 = *(undefined4 *)
                 ((long)iVar4.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                        ._M_cur + 0xc);
        *(undefined4 *)
         ((long)iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur + 0xc) =
             *(undefined4 *)
              ((long)iVar5.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                     _M_cur + 0xc);
        *(undefined4 *)
         ((long)iVar5.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                _M_cur + 0xc) = uVar2;
        return;
      }
    }
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

inline void Chain_matrix<Master_matrix>::multiply_target_and_add_to(Index sourceColumnIndex,
                                                                    const Field_element& coefficient,
                                                                    Index targetColumnIndex)
{
  auto& col = get_column(targetColumnIndex);
  _add_to(col, [&]() { col.multiply_target_and_add(coefficient, get_column(sourceColumnIndex)); });
}